

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_vector.h
# Opt level: O3

void lzham::vector<lzham::lzcompressor::lzpriced_decision>::object_mover
               (void *pDst_void,void *pSrc_void,uint num)

{
  undefined8 uVar1;
  long lVar2;
  lzpriced_decision *pSrc;
  
  if (num != 0) {
    lVar2 = 0;
    do {
      *(undefined8 *)((long)pDst_void + lVar2 + 0x10) =
           *(undefined8 *)((long)pSrc_void + lVar2 + 0x10);
      uVar1 = ((undefined8 *)((long)pSrc_void + lVar2))[1];
      *(undefined8 *)((long)pDst_void + lVar2) = *(undefined8 *)((long)pSrc_void + lVar2);
      ((undefined8 *)((long)pDst_void + lVar2))[1] = uVar1;
      lVar2 = lVar2 + 0x18;
    } while ((ulong)num * 0x18 != lVar2);
  }
  return;
}

Assistant:

static void object_mover(void* pDst_void, void* pSrc_void, uint num)
      {
         T* pSrc = static_cast<T*>(pSrc_void);
         T* const pSrc_end = pSrc + num;
         T* pDst = static_cast<T*>(pDst_void);

         while (pSrc != pSrc_end)
         {
            new (static_cast<void*>(pDst)) T(*pSrc);
            pSrc->~T();
            pSrc++;
            pDst++;
         }
      }